

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PigLatinTranslator.cpp
# Opt level: O0

bool is_all_upper_case(string *str)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  iterator letter;
  bool isTrue;
  string *str_local;
  
  letter._M_current._7_1_ = 1;
  local_20._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_28._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_20);
    bVar1 = is_upper_case(*pcVar2);
    letter._M_current._7_1_ = (letter._M_current._7_1_ & 1 & bVar1) != 0;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_20,0);
  }
  return (bool)(letter._M_current._7_1_ & 1);
}

Assistant:

bool is_all_upper_case(std::string str) {
  bool isTrue = true;
  for(std::string::iterator letter = str.begin(); letter != str.end(); letter++) {
    isTrue &= is_upper_case(*letter);
  }
  return isTrue;
}